

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

void * HTS_calloc(size_t num,size_t size)

{
  void *__s;
  size_t __size;
  
  __size = num * size;
  if (__size == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc(__size);
    memset(__s,0,__size);
    if (__s == (void *)0x0) {
      HTS_error(1,"HTS_calloc: Cannot allocate memory.\n");
    }
  }
  return __s;
}

Assistant:

void *HTS_calloc(const size_t num, const size_t size)
{
   size_t n = num * size;
   void *mem;

   if (n == 0)
      return NULL;

#ifdef FESTIVAL
   mem = (void *) safe_wcalloc(n);
#else
   mem = (void *) malloc(n);
#endif                          /* FESTIVAL */

   memset(mem, 0, n);

   if (mem == NULL)
      HTS_error(1, "HTS_calloc: Cannot allocate memory.\n");

   return mem;
}